

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  bool bVar17;
  uint32_t i_2;
  uint uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  byte *sels_00;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint8_t *puVar36;
  uint32_t i;
  int iVar37;
  uint uVar38;
  uint32_t hb;
  uint32_t i_3;
  uint uVar39;
  uint32_t ls_pass;
  uint uVar40;
  int iVar41;
  uint uVar42;
  float fVar43;
  undefined1 auVar44 [15];
  float fVar47;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  uint local_c4;
  uint32_t local_c0;
  uint local_b4;
  ulong local_b0;
  vec3F xl;
  float cov [6];
  uint8_t sels [16];
  
  if ((flags & 4) != 0) {
    uVar22 = *(uint *)((long)pDst + 4);
    puVar36 = sels;
    local_b0 = 0;
    lVar21 = 0;
    do {
      *puVar36 = ""[uVar22 >> ((byte)lVar21 & 0x1f) & 3];
      lVar21 = lVar21 + 2;
      puVar36 = puVar36 + 1;
    } while (lVar21 != 0x20);
    local_b4 = 0xffffffff;
    local_c4 = 0;
LAB_00136ee2:
    iVar33 = 3;
    if ((flags & 2) == 0) {
      iVar33 = (flags & 1) + 1;
    }
    iVar41 = 0;
    do {
      bVar17 = compute_least_squares_endpoints_rgb((color32 *)pPixels,sels,&xl,(vec3F *)cov);
      if (bVar17) {
        auVar45._0_4_ = (int)(cov[0] * 0.12156863 + 0.5);
        auVar45._4_4_ = (int)(xl.c[0] * 0.12156863 + 0.5);
        auVar45._8_4_ = (int)(xl.c[1] * 0.24705882 + 0.5);
        auVar45._12_4_ = (int)(xl.c[2] * 0.12156863 + 0.5);
        auVar49._0_4_ = -(uint)(auVar45._0_4_ < (int)DAT_001e3a50);
        auVar49._4_4_ = -(uint)(auVar45._4_4_ < DAT_001e3a50._4_4_);
        auVar49._8_4_ = -(uint)(auVar45._8_4_ < DAT_001e3a50._8_4_);
        auVar49._12_4_ = -(uint)(auVar45._12_4_ < DAT_001e3a50._12_4_);
        auVar50 = ~auVar49 & _DAT_001e3a50 | auVar45 & auVar49;
        local_c0 = (uint32_t)(cov[1] * 0.24705882 + 0.5);
        if (0x3e < (int)local_c0) {
          local_c0 = 0x3f;
        }
        hb = (uint32_t)(cov[2] * 0.12156863 + 0.5);
        if ((int)local_c0 < 1) {
          local_c0 = 0;
        }
        auVar46._0_4_ = -(uint)(0 < auVar50._0_4_);
        auVar46._4_4_ = -(uint)(0 < auVar50._4_4_);
        auVar46._8_4_ = -(uint)(0 < auVar50._8_4_);
        auVar46._12_4_ = -(uint)(0 < auVar50._12_4_);
        if (0x1e < (int)hb) {
          hb = 0x1f;
        }
        auVar50 = auVar46 & auVar50;
        if ((int)hb < 1) {
          hb = 0;
        }
      }
      else {
        if ((int)local_b4 < 0) {
          lVar21 = 0;
          iVar32 = 0;
          iVar19 = 0;
          iVar28 = 0;
          do {
            iVar28 = iVar28 + (uint)pPixels[lVar21 * 4];
            iVar19 = iVar19 + (uint)pPixels[lVar21 * 4 + 1];
            iVar32 = iVar32 + (uint)pPixels[lVar21 * 4 + 2];
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x10);
          local_b4 = iVar28 + 8U >> 4;
          local_c4 = iVar19 + 8U >> 4;
          local_b0 = (ulong)(iVar32 + 8U >> 4);
        }
        auVar50 = psllw(ZEXT216(*(ushort *)(g_bc1_match5_equals_1 + (ulong)local_b4 * 2)),8);
        auVar44 = ZEXT115((byte)g_bc1_match5_equals_1[local_b0 * 2]) << 0x18 |
                  (~DAT_001e3660._0_15_ &
                   ZEXT115((byte)g_bc1_match6_equals_1[(ulong)local_c4 * 2]) << 0x10 |
                  (auVar50._0_15_ |
                  ZEXT215(*(ushort *)(g_bc1_match5_equals_1 + (ulong)local_b4 * 2) >> 8)) &
                  DAT_001e3660._0_15_) & DAT_001e3670._0_15_;
        auVar3[0xd] = 0;
        auVar3._0_13_ = auVar44._0_13_;
        auVar3[0xe] = auVar44[7];
        auVar5[0xc] = auVar44[6];
        auVar5._0_12_ = auVar44._0_12_;
        auVar5._13_2_ = auVar3._13_2_;
        auVar6[0xb] = 0;
        auVar6._0_11_ = auVar44._0_11_;
        auVar6._12_3_ = auVar5._12_3_;
        auVar7[10] = auVar44[5];
        auVar7._0_10_ = auVar44._0_10_;
        auVar7._11_4_ = auVar6._11_4_;
        auVar8[9] = 0;
        auVar8._0_9_ = auVar44._0_9_;
        auVar8._10_5_ = auVar7._10_5_;
        auVar9[8] = auVar44[4];
        auVar9._0_8_ = auVar44._0_8_;
        auVar9._9_6_ = auVar8._9_6_;
        auVar10._7_8_ = 0;
        auVar10._0_7_ = auVar9._8_7_;
        Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),auVar44[3]);
        auVar15._9_6_ = 0;
        auVar15._0_9_ = Var11;
        auVar12._1_10_ = SUB1510(auVar15 << 0x30,5);
        auVar12[0] = auVar44[2];
        auVar16._11_4_ = 0;
        auVar16._0_11_ = auVar12;
        auVar13._1_12_ = SUB1512(auVar16 << 0x20,3);
        auVar13[0] = auVar44[1];
        auVar50._0_2_ = CONCAT11(0,auVar44[0]);
        auVar44._2_13_ = auVar13;
        auVar44._0_2_ = auVar50._0_2_;
        auVar4._10_2_ = 0;
        auVar4._0_10_ = auVar44._0_10_;
        auVar4._12_2_ = (short)Var11;
        auVar14._2_4_ = auVar4._10_4_;
        auVar14._0_2_ = auVar12._0_2_;
        auVar14._6_8_ = 0;
        auVar50._6_8_ = SUB148(auVar14 << 0x40,6);
        auVar50._4_2_ = auVar13._0_2_;
        auVar50._2_2_ = 0;
        auVar50._14_2_ = 0;
        local_c0 = (uint32_t)(byte)g_bc1_match6_equals_1[(ulong)local_c4 * 2 + 1];
        hb = (uint32_t)(byte)g_bc1_match5_equals_1[local_b0 * 2 + 1];
      }
      sels_00 = sels;
      bc1_find_sels((color32 *)pPixels,auVar50._4_4_,auVar50._8_4_,auVar50._12_4_,auVar50._0_4_,
                    local_c0,hb,sels_00);
      iVar41 = iVar41 + 1;
    } while (iVar41 != iVar33);
    uVar30 = (auVar50._4_4_ << 0xb | auVar50._8_4_ << 5 | auVar50._12_4_) & 0xffff;
    uVar22 = (local_c0 << 5 | hb | auVar50._0_4_ << 0xb) & 0xffff;
    if (uVar30 == uVar22) {
      iVar33 = uVar30 - 1;
      if (uVar30 == 0) {
        iVar33 = 0;
      }
      iVar41 = uVar30 + (uVar30 == 0);
      *(char *)pDst = (char)iVar41;
      *(char *)((long)pDst + 1) = (char)((uint)iVar41 >> 8);
      *(char *)((long)pDst + 2) = (char)iVar33;
      *(char *)((long)pDst + 3) = (char)((uint)iVar33 >> 8);
      iVar33 = 0x55555555;
      if (uVar30 != 0) {
        iVar33 = 0;
      }
      *(int *)((long)pDst + 4) = iVar33;
    }
    else {
      uVar20 = 0;
      uVar31 = uVar22;
      if (uVar22 < uVar30) {
        uVar31 = uVar30;
      }
      uVar29 = uVar22;
      if (uVar30 < uVar22) {
        uVar29 = uVar30;
      }
      bVar24 = 0x55;
      if (uVar30 >= uVar22) {
        bVar24 = 0;
      }
      if (uVar31 <= uVar29) {
        __assert_fail("lc16 > hc16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x3b0e,"void basist::encode_bc1(void *, const uint8_t *, uint32_t)");
      }
      *(char *)pDst = (char)uVar31;
      *(char *)((long)pDst + 1) = (char)(uVar31 >> 8);
      *(char *)((long)pDst + 2) = (char)uVar29;
      *(char *)((long)pDst + 3) = (char)(uVar29 >> 8);
      lVar21 = 0;
      do {
        uVar20 = uVar20 | (uint)""[*sels_00] << ((byte)lVar21 & 0x1f);
        lVar21 = lVar21 + 2;
        sels_00 = sels_00 + 1;
      } while (lVar21 != 0x20);
      *(byte *)((long)pDst + 4) = (byte)uVar20 ^ bVar24;
      *(byte *)((long)pDst + 5) = (byte)(uVar20 >> 8) ^ bVar24;
      *(byte *)((long)pDst + 6) = (byte)(uVar20 >> 0x10) ^ bVar24;
      *(byte *)((long)pDst + 7) = (byte)(uVar20 >> 0x18) ^ bVar24;
    }
    return;
  }
  uVar31 = (uint)*pPixels;
  uVar22 = (uint)pPixels[1];
  uVar30 = (uint)pPixels[2];
  lVar21 = 1;
  while (((pPixels[lVar21 * 4] == *pPixels && (pPixels[lVar21 * 4 + 1] == pPixels[1])) &&
         (pPixels[lVar21 * 4 + 2] == pPixels[2]))) {
    lVar21 = lVar21 + 1;
    if (lVar21 == 0x10) {
LAB_00136b27:
      encode_bc1_solid_block(pDst,uVar31,uVar22,uVar30);
      return;
    }
  }
  if (lVar21 != 0x10) {
    lVar21 = 1;
    uVar20 = uVar30;
    uVar25 = uVar30;
    uVar29 = uVar22;
    uVar40 = uVar31;
    uVar42 = uVar22;
    uVar34 = uVar31;
    do {
      bVar24 = pPixels[lVar21 * 4];
      uVar18 = (uint)bVar24;
      if (uVar34 <= bVar24) {
        uVar34 = uVar18;
      }
      bVar1 = pPixels[lVar21 * 4 + 1];
      uVar38 = (uint)bVar1;
      if (uVar42 <= bVar1) {
        uVar42 = uVar38;
      }
      bVar2 = pPixels[lVar21 * 4 + 2];
      uVar39 = (uint)bVar2;
      if (uVar30 <= bVar2) {
        uVar30 = uVar39;
      }
      if (uVar18 <= uVar40) {
        uVar40 = uVar18;
      }
      if (uVar38 <= uVar22) {
        uVar22 = uVar38;
      }
      if (uVar39 <= uVar20) {
        uVar20 = uVar39;
      }
      uVar31 = uVar31 + bVar24;
      uVar29 = uVar29 + bVar1;
      uVar25 = uVar25 + bVar2;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x10);
    local_b4 = uVar31 + 8 >> 4;
    local_c4 = uVar29 + 8 >> 4;
    uVar31 = uVar25 + 8 >> 4;
    local_b0 = (ulong)uVar31;
    lVar21 = 0;
    xl.c[0] = 0.0;
    xl.c[1] = 0.0;
    xl.c[2] = 0.0;
    do {
      iVar33 = pPixels[lVar21 * 4] - local_b4;
      xl.c[0] = (float)((int)xl.c[0] + iVar33 * iVar33);
      xl.c[1] = (float)((int)xl.c[1] + (pPixels[lVar21 * 4 + 1] - local_c4) * iVar33);
      xl.c[2] = (float)((int)xl.c[2] + iVar33 * (pPixels[lVar21 * 4 + 2] - uVar31));
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0x10);
    lVar21 = 0;
    do {
      cov[lVar21] = (float)(int)xl.c[lVar21] * 0.003921569;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 6);
    fVar51 = (float)(int)(uVar34 - uVar40);
    fVar43 = (float)(int)(uVar42 - uVar22);
    fVar48 = (float)(int)(uVar30 - uVar20);
    iVar33 = 4;
    do {
      fVar52 = fVar51 * cov[1];
      fVar53 = fVar51 * cov[2];
      fVar47 = fVar43 * SUB84(cov._12_8_,4);
      fVar51 = fVar48 * cov[2] + fVar43 * cov[1] + fVar51 * cov[0];
      fVar43 = fVar43 * (float)cov._12_8_ + fVar52 + fVar48 * SUB84(cov._12_8_,4);
      fVar48 = fVar47 + fVar53 + fVar48 * cov[5];
      iVar33 = iVar33 + -1;
    } while (iVar33 != 0);
    fVar47 = ABS(fVar51);
    if (ABS(fVar51) <= ABS(fVar43)) {
      fVar47 = ABS(fVar43);
    }
    if (fVar47 <= ABS(fVar48)) {
      fVar47 = ABS(fVar48);
    }
    if (2.0 <= fVar47) {
      fVar47 = 1024.0 / fVar47;
      iVar33 = (int)(fVar51 * fVar47);
      iVar41 = (int)(fVar43 * fVar47);
      iVar28 = (int)(fVar48 * fVar47);
    }
    else {
      iVar41 = 0x259;
      iVar28 = 0x75;
      iVar33 = 0x132;
    }
    iVar32 = -0x80000000;
    lVar21 = 0;
    iVar19 = 0;
    iVar35 = 0;
    iVar26 = 0x7fffffff;
    do {
      iVar37 = (uint)(byte)(*(ushort *)(pPixels + lVar21 * 4 + 1) >> 8) * iVar28 +
               (uint)(*(ushort *)(pPixels + lVar21 * 4 + 1) & 0xff) * iVar41 +
               (uint)pPixels[lVar21 * 4] * iVar33;
      iVar27 = iVar26;
      if (iVar37 < iVar26) {
        iVar27 = iVar37;
      }
      if (iVar37 < iVar26) {
        iVar35 = (int)lVar21;
      }
      if (iVar32 < iVar37) {
        iVar19 = (int)lVar21;
        iVar32 = iVar37;
      }
      lVar21 = lVar21 + 1;
      iVar26 = iVar27;
    } while (lVar21 != 0x10);
    lVar23 = (long)iVar35;
    lVar21 = (long)iVar19;
    bc1_find_sels((color32 *)pPixels,
                  (uint)pPixels[lVar23 * 4] * 0x1f + ((uint)pPixels[lVar23 * 4] * 0x1f + 0x80 >> 8)
                  + 0x80 >> 8,
                  ((uint)pPixels[lVar23 * 4 + 1] * 0x3f + 0x80 >> 8) +
                  (uint)pPixels[lVar23 * 4 + 1] * 0x3f + 0x80 >> 8,
                  ((uint)pPixels[lVar23 * 4 + 2] * 0x1f + 0x80 >> 8) +
                  (uint)pPixels[lVar23 * 4 + 2] * 0x1f + 0x80 >> 8,
                  ((uint)pPixels[lVar21 * 4] * 0x1f + 0x80 >> 8) + (uint)pPixels[lVar21 * 4] * 0x1f
                  + 0x80 >> 8,
                  ((uint)pPixels[lVar21 * 4 + 1] * 0x3f + 0x80 >> 8) +
                  (uint)pPixels[lVar21 * 4 + 1] * 0x3f + 0x80 >> 8,
                  ((uint)pPixels[lVar21 * 4 + 2] * 0x1f + 0x80 >> 8) +
                  (uint)pPixels[lVar21 * 4 + 2] * 0x1f + 0x80 >> 8,sels);
    goto LAB_00136ee2;
  }
  goto LAB_00136b27;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags)
	{
		const color32* pSrc_pixels = (const color32*)pPixels;
		dxt1_block* pDst_block = static_cast<dxt1_block*>(pDst);
		
		int avg_r = -1, avg_g = 0, avg_b = 0;
		int lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
		uint8_t sels[16];
		
		const bool use_sels = (flags & cEncodeBC1UseSelectors) != 0;
		if (use_sels)
		{
			// Caller is jamming in their own selectors for us to try.
			const uint32_t s = pDst_block->m_selectors[0] | (pDst_block->m_selectors[1] << 8) | (pDst_block->m_selectors[2] << 16) | (pDst_block->m_selectors[3] << 24);
			
			static const uint8_t s_sel_tran[4] = { 0, 3, 1, 2 };
			
			for (uint32_t i = 0; i < 16; i++)
				sels[i] = s_sel_tran[(s >> (i * 2)) & 3];
		}
		else
		{
			const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

			uint32_t j;
			for (j = 1; j < 16; j++)
				if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
					break;
						
			if (j == 16)
			{
				encode_bc1_solid_block(pDst, fr, fg, fb);
				return;
			}
			
			// Select 2 colors along the principle axis. (There must be a faster/simpler way.)
			int total_r = fr, total_g = fg, total_b = fb;
			int max_r = fr, max_g = fg, max_b = fb;
			int min_r = fr, min_g = fg, min_b = fb;
			for (uint32_t i = 1; i < 16; i++)
			{
				const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
				max_r = basisu::maximum(max_r, r); max_g = basisu::maximum(max_g, g); max_b = basisu::maximum(max_b, b);
				min_r = basisu::minimum(min_r, r); min_g = basisu::minimum(min_g, g); min_b = basisu::minimum(min_b, b);
				total_r += r; total_g += g; total_b += b;
			}

			avg_r = (total_r + 8) >> 4;
			avg_g = (total_g + 8) >> 4;
			avg_b = (total_b + 8) >> 4;

			int icov[6] = { 0, 0, 0, 0, 0, 0 };
			for (uint32_t i = 0; i < 16; i++)
			{
				int r = (int)pSrc_pixels[i].r - avg_r;
				int g = (int)pSrc_pixels[i].g - avg_g;
				int b = (int)pSrc_pixels[i].b - avg_b;
				icov[0] += r * r;
				icov[1] += r * g;
				icov[2] += r * b;
				icov[3] += g * g;
				icov[4] += g * b;
				icov[5] += b * b;
			}

			float cov[6];
			for (uint32_t i = 0; i < 6; i++)
				cov[i] = static_cast<float>(icov[i])* (1.0f / 255.0f);
			
#if 0
			// Seems silly to use full PCA to choose 2 colors. The diff in avg. PSNR between using PCA vs. not is small (~.025 difference).
			// TODO: Try 2 or 3 different normalized diagonal vectors, choose the one that results in the largest dot delta
			int saxis_r = max_r - min_r;
			int saxis_g = max_g - min_g;
			int saxis_b = max_b - min_b;
#else
			float xr = (float)(max_r - min_r);
			float xg = (float)(max_g - min_g);
			float xb = (float)(max_b - min_b);
			//float xr = (float)(max_r - avg_r); // max-avg is nearly the same, and doesn't require computing min's
			//float xg = (float)(max_g - avg_g);
			//float xb = (float)(max_b - avg_b);
			for (uint32_t power_iter = 0; power_iter < 4; power_iter++)
			{
				float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
				float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
				float b = xr * cov[2] + xg * cov[4] + xb * cov[5];
				xr = r; xg = g; xb = b;
			}

			float k = basisu::maximum(fabsf(xr), fabsf(xg), fabsf(xb));
			int saxis_r = 306, saxis_g = 601, saxis_b = 117;
			if (k >= 2)
			{
				float m = 1024.0f / k;
				saxis_r = (int)(xr * m);
				saxis_g = (int)(xg * m);
				saxis_b = (int)(xb * m);
			}
#endif
			
			int low_dot = INT_MAX, high_dot = INT_MIN, low_c = 0, high_c = 0;
			for (uint32_t i = 0; i < 16; i++)
			{
				int dot = pSrc_pixels[i].r * saxis_r + pSrc_pixels[i].g * saxis_g + pSrc_pixels[i].b * saxis_b;
				if (dot < low_dot)
				{
					low_dot = dot;
					low_c = i;
				}
				if (dot > high_dot)
				{
					high_dot = dot;
					high_c = i;
				}
			}

			lr = to_5(pSrc_pixels[low_c].r);
			lg = to_6(pSrc_pixels[low_c].g);
			lb = to_5(pSrc_pixels[low_c].b);

			hr = to_5(pSrc_pixels[high_c].r);
			hg = to_6(pSrc_pixels[high_c].g);
			hb = to_5(pSrc_pixels[high_c].b);
						
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		} // if (use_sels)

		const uint32_t total_ls_passes = (flags & cEncodeBC1HigherQuality) ? 3 : (flags & cEncodeBC1HighQuality ? 2 : 1);
		for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
		{
			// This is where the real magic happens. We have an array of candidate selectors, so let's use least squares to compute the optimal low/high endpoint colors.
			vec3F xl, xh;
			if (!compute_least_squares_endpoints_rgb(pSrc_pixels, sels, &xl, &xh))
			{
				if (avg_r < 0)
				{
					int total_r = 0, total_g = 0, total_b = 0;
					for (uint32_t i = 0; i < 16; i++)
					{
						total_r += pSrc_pixels[i].r;
						total_g += pSrc_pixels[i].g;
						total_b += pSrc_pixels[i].b;
					}

					avg_r = (total_r + 8) >> 4;
					avg_g = (total_g + 8) >> 4;
					avg_b = (total_b + 8) >> 4;
				}

				// All selectors equal - treat it as a solid block which should always be equal or better.
				lr = g_bc1_match5_equals_1[avg_r].m_hi;
				lg = g_bc1_match6_equals_1[avg_g].m_hi;
				lb = g_bc1_match5_equals_1[avg_b].m_hi;

				hr = g_bc1_match5_equals_1[avg_r].m_lo;
				hg = g_bc1_match6_equals_1[avg_g].m_lo;
				hb = g_bc1_match5_equals_1[avg_b].m_lo;

				// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
			}
			else
			{
				lr = basisu::clamp((int)((xl.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				lg = basisu::clamp((int)((xl.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				lb = basisu::clamp((int)((xl.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);

				hr = basisu::clamp((int)((xh.c[0]) * (31.0f / 255.0f) + .5f), 0, 31);
				hg = basisu::clamp((int)((xh.c[1]) * (63.0f / 255.0f) + .5f), 0, 63);
				hb = basisu::clamp((int)((xh.c[2]) * (31.0f / 255.0f) + .5f), 0, 31);
			}
									
			bc1_find_sels(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);
		}

		uint32_t lc16 = dxt1_block::pack_unscaled_color(lr, lg, lb);
		uint32_t hc16 = dxt1_block::pack_unscaled_color(hr, hg, hb);
				
		// Always forbid 3 color blocks
		if (lc16 == hc16)
		{
			uint8_t mask = 0;

			// Make l > h
			if (hc16 > 0)
				hc16--;
			else
			{
				// lc16 = hc16 = 0
				assert(lc16 == hc16 && hc16 == 0);

				hc16 = 0;
				lc16 = 1;
				mask = 0x55; // select hc16
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color(static_cast<uint16_t>(lc16));
			pDst_block->set_high_color(static_cast<uint16_t>(hc16));

			pDst_block->m_selectors[0] = mask;
			pDst_block->m_selectors[1] = mask;
			pDst_block->m_selectors[2] = mask;
			pDst_block->m_selectors[3] = mask;
		}
		else
		{
			uint8_t invert_mask = 0;
			if (lc16 < hc16)
			{
				std::swap(lc16, hc16);
				invert_mask = 0x55;
			}

			assert(lc16 > hc16);
			pDst_block->set_low_color((uint16_t)lc16);
			pDst_block->set_high_color((uint16_t)hc16);

			uint32_t packed_sels = 0;
			static const uint8_t s_sel_trans[4] = { 0, 2, 3, 1 };
			for (uint32_t i = 0; i < 16; i++)
				packed_sels |= ((uint32_t)s_sel_trans[sels[i]] << (i * 2));

			pDst_block->m_selectors[0] = (uint8_t)packed_sels ^ invert_mask;
			pDst_block->m_selectors[1] = (uint8_t)(packed_sels >> 8) ^ invert_mask;
			pDst_block->m_selectors[2] = (uint8_t)(packed_sels >> 16) ^ invert_mask;
			pDst_block->m_selectors[3] = (uint8_t)(packed_sels >> 24) ^ invert_mask;
		}
	}